

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

Value __thiscall Frame::getLocalVariableValue(Frame *this,uint32_t index)

{
  ostream *this_00;
  mapped_type *pmVar1;
  Value VVar2;
  uint32_t local_24;
  Frame *pFStack_20;
  uint32_t index_local;
  Frame *this_local;
  undefined1 auVar3 [12];
  
  local_24 = index;
  pFStack_20 = this;
  if (this->_codeAttribute->max_locals <= index) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Tentando acessar variavel local inexistente");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  pmVar1 = std::
           map<unsigned_int,_Value,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Value>_>_>
           ::operator[](&this->_localVariables,&local_24);
  VVar2.printType = pmVar1->printType;
  auVar3._4_4_ = pmVar1->type;
  VVar2.data = pmVar1->data;
  return VVar2;
}

Assistant:

Value Frame::getLocalVariableValue(uint32_t index) {
    if (index >= _codeAttribute->max_locals) {
        cerr << "Tentando acessar variavel local inexistente" << endl;
        exit(1);
    }
    
    return _localVariables[index];
}